

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

IndirOpnd * __thiscall
IR::Instr::HoistMemRefAddress(Instr *this,MemRefOpnd *memRefOpnd,OpCode loadOpCode)

{
  void *originalAddress;
  Func *func;
  code *pcVar1;
  bool bVar2;
  AddrOpndKind addrOpndKind;
  OpndKind OVar3;
  undefined4 *puVar4;
  AddrOpnd *pAVar5;
  IndirOpnd *pIVar6;
  RegOpnd *baseOpnd;
  Instr *instr;
  
  if (memRefOpnd == (MemRefOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xa3b,"(memRefOpnd)","memRefOpnd");
    if (!bVar2) goto LAB_004b7ec4;
    *puVar4 = 0;
    if ((int)_DAT_00000010 == _DAT_00000010) goto LAB_004b7d37;
  }
  else if ((long)(int)memRefOpnd->m_memLoc == memRefOpnd->m_memLoc) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_004b7d37:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xa3d,"(!LowererMDArch::IsLegalMemLoc(memRefOpnd))",
                       "!LowererMDArch::IsLegalMemLoc(memRefOpnd)");
    if (!bVar2) goto LAB_004b7ec4;
    *puVar4 = 0;
  }
  originalAddress = (void *)memRefOpnd->m_memLoc;
  addrOpndKind = MemRefOpnd::GetAddrKind(memRefOpnd);
  func = this->m_func;
  pAVar5 = AddrOpnd::New((intptr_t)originalAddress,addrOpndKind,func,true,(Var)0x0);
  pIVar6 = Func::GetConstantAddressIndirOpnd
                     (func->topFunc,(intptr_t)originalAddress,&pAVar5->super_Opnd,addrOpndKind,
                      (memRefOpnd->super_Opnd).m_type,loadOpCode);
  if (pIVar6 == (IndirOpnd *)0x0) {
    baseOpnd = RegOpnd::New(TyUint64,func);
    pAVar5 = AddrOpnd::New((intptr_t)originalAddress,addrOpndKind,func,true,(Var)0x0);
    instr = New(loadOpCode,&baseOpnd->super_Opnd,&pAVar5->super_Opnd,func);
    InsertBefore(this,instr);
    pIVar6 = IndirOpnd::New(baseOpnd,0,(memRefOpnd->super_Opnd).m_type,func,true);
    IndirOpnd::SetAddrKind(pIVar6,addrOpndKind,originalAddress);
  }
  pIVar6 = (IndirOpnd *)DeepReplace(this,&memRefOpnd->super_Opnd,&pIVar6->super_Opnd);
  OVar3 = Opnd::GetKind((Opnd *)pIVar6);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar2) {
LAB_004b7ec4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return pIVar6;
}

Assistant:

IndirOpnd *
Instr::HoistMemRefAddress(MemRefOpnd *const memRefOpnd, const Js::OpCode loadOpCode)
{
    Assert(memRefOpnd);
#if defined(_M_IX86) || defined(_M_X64)
    Assert(!LowererMDArch::IsLegalMemLoc(memRefOpnd));
#endif
    intptr_t address = memRefOpnd->GetMemLoc();
    IR::AddrOpndKind kind = memRefOpnd->GetAddrKind();
    Func *const func = m_func;
    IR::AddrOpnd * addrOpnd = IR::AddrOpnd::New(address, kind, this->m_func, true);
    IR::IndirOpnd * indirOpnd = func->GetTopFunc()->GetConstantAddressIndirOpnd(address, addrOpnd, kind, memRefOpnd->GetType(), loadOpCode);

    if (indirOpnd == nullptr)
    {
        IR::RegOpnd * addressRegOpnd = IR::RegOpnd::New(TyMachPtr, func);
        IR::Instr *const newInstr =
            IR::Instr::New(
            loadOpCode,
            addressRegOpnd,
            IR::AddrOpnd::New(address, kind, func, true),
            func);
        InsertBefore(newInstr);

        indirOpnd = IR::IndirOpnd::New(addressRegOpnd, 0, memRefOpnd->GetType(), func, true);
#if DBG_DUMP
        // TODO: michhol oop jit, make intptr
        indirOpnd->SetAddrKind(kind, (void*)address);
#endif
    }
    return DeepReplace(memRefOpnd, indirOpnd)->AsIndirOpnd();
}